

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstream.c
# Opt level: O3

ktx_error_code_e ktxMemStream_skip(ktxStream *str,ktx_size_t count)

{
  FILE *pFVar1;
  ktx_error_code_e kVar2;
  char *pcVar3;
  
  kVar2 = KTX_INVALID_VALUE;
  if ((str != (ktxStream *)0x0) && (pFVar1 = (str->data).file, pFVar1 != (FILE *)0x0)) {
    pcVar3 = pFVar1->_IO_write_base + count;
    kVar2 = KTX_FILE_UNEXPECTED_EOF;
    if (((long)pFVar1->_IO_write_base <= (long)pcVar3) && (pcVar3 <= pFVar1->_IO_read_base)) {
      pFVar1->_IO_write_base = pcVar3;
      kVar2 = KTX_SUCCESS;
    }
  }
  return kVar2;
}

Assistant:

static
KTX_error_code ktxMemStream_skip(ktxStream* str, const ktx_size_t count)
{
    ktxMem* mem;
    ktx_off_t newpos;

    if (!str || (mem = str->data.mem) == 0)
        return KTX_INVALID_VALUE;

    newpos = mem->pos + count;
    /* The first clause checks for overflow. */
    if (newpos < mem->pos || (ktx_size_t)newpos > mem->used_size)
        return KTX_FILE_UNEXPECTED_EOF;

    mem->pos = newpos;

    return KTX_SUCCESS;
}